

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCompoundShape.cpp
# Opt level: O2

void __thiscall btCompoundShape::createAabbTreeFromChildren(btCompoundShape *this)

{
  btCompoundShapeChild *pbVar1;
  long *plVar2;
  btDbvt *this_00;
  btDbvtNode *pbVar3;
  long lVar4;
  int index;
  void *data;
  btVector3 localAabbMax;
  btVector3 localAabbMin;
  btDbvtVolume bounds;
  
  if (this->m_dynamicAabbTree != (btDbvt *)0x0) {
    return;
  }
  this_00 = (btDbvt *)btAlignedAllocInternal(0x60,0x10);
  btDbvt::btDbvt(this_00);
  this->m_dynamicAabbTree = this_00;
  lVar4 = 0;
  for (data = (void *)0x0; (long)data < (long)(this->m_children).m_size;
      data = (void *)((long)data + 1)) {
    pbVar1 = (this->m_children).m_data;
    plVar2 = *(long **)((long)(&pbVar1->m_transform + 1) + lVar4);
    (**(code **)(*plVar2 + 0x10))
              (plVar2,(long)(pbVar1->m_transform).m_basis.m_el[0].m_floats + lVar4,&localAabbMin,
               &localAabbMax);
    bounds.mi.m_floats[0] = localAabbMin.m_floats[0];
    bounds.mi.m_floats[1] = localAabbMin.m_floats[1];
    bounds.mi.m_floats[2] = localAabbMin.m_floats[2];
    bounds.mi.m_floats[3] = localAabbMin.m_floats[3];
    bounds.mx.m_floats[0] = localAabbMax.m_floats[0];
    bounds.mx.m_floats[1] = localAabbMax.m_floats[1];
    bounds.mx.m_floats[2] = localAabbMax.m_floats[2];
    bounds.mx.m_floats[3] = localAabbMax.m_floats[3];
    pbVar3 = btDbvt::insert(this->m_dynamicAabbTree,&bounds,data);
    *(btDbvtNode **)((long)(&pbVar1->m_transform + 1) + lVar4 + 0x10) = pbVar3;
    lVar4 = lVar4 + 0x58;
  }
  return;
}

Assistant:

void btCompoundShape::createAabbTreeFromChildren()
{
    if ( !m_dynamicAabbTree )
    {
        void* mem = btAlignedAlloc(sizeof(btDbvt),16);
        m_dynamicAabbTree = new(mem) btDbvt();
        btAssert(mem==m_dynamicAabbTree);

        for ( int index = 0; index < m_children.size(); index++ )
        {
            btCompoundShapeChild &child = m_children[index];

            //extend the local aabbMin/aabbMax
            btVector3 localAabbMin,localAabbMax;
            child.m_childShape->getAabb(child.m_transform,localAabbMin,localAabbMax);

            const btDbvtVolume  bounds=btDbvtVolume::FromMM(localAabbMin,localAabbMax);
			size_t index2 = index;
            child.m_node = m_dynamicAabbTree->insert(bounds, reinterpret_cast<void*>(index2) );
        }
    }
}